

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O0

bool pstore::operator==(sstring_view<const_char_*> *lhs,char **rhs)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char **rhs_local;
  sstring_view<const_char_*> *lhs_local;
  
  sVar2 = string_traits<pstore::sstring_view<const_char_*>_>::length(lhs);
  sVar3 = string_traits<const_char_*>::length(*rhs);
  if (sVar2 == sVar3) {
    iVar1 = sstring_view<char_const*>::compare<char_const*>((sstring_view<char_const*> *)lhs,rhs);
    lhs_local._7_1_ = iVar1 == 0;
  }
  else {
    lhs_local._7_1_ = false;
  }
  return lhs_local._7_1_;
}

Assistant:

inline bool operator== (sstring_view<PointerType> const & lhs,
                            StringType const & rhs) noexcept {
        if (string_traits<sstring_view<PointerType>>::length (lhs) !=
            string_traits<StringType>::length (rhs)) {
            return false;
        }
        return lhs.compare (rhs) == 0;
    }